

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>,duckdb::list_entry_t,duckdb::QuantileListOperation<duckdb::dtime_t,false>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  list_entry_t *rdata_1;
  QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> **sdata_1;
  AggregateFinalizeData finalize_data;
  list_entry_t *rdata;
  QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> **sdata;
  ulong local_80;
  AggregateFinalizeData local_78;
  list_entry_t *local_60;
  QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> **local_58;
  AggregateFinalizeData local_50;
  list_entry_t *local_38;
  QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> **local_30;
  long local_28;
  ulong local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::
               GetData<duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>*>
                         ((Vector *)0xaae1a0);
    local_38 = ConstantVector::GetData<duckdb::list_entry_t>((Vector *)0xaae1af);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    QuantileListOperation<duckdb::dtime_t,false>::
    Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>>
              ((QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> *)finalize_data.input,
               (list_entry_t *)finalize_data.result,(AggregateFinalizeData *)sdata_1);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::
               GetData<duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>*>
                         ((Vector *)0xaae1fd);
    local_60 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xaae20c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (local_80 = 0; local_80 < local_20; local_80 = local_80 + 1) {
      local_78.result_idx = local_80 + local_28;
      QuantileListOperation<duckdb::dtime_t,false>::
      Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>>
                ((QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> *)finalize_data.input
                 ,(list_entry_t *)finalize_data.result,(AggregateFinalizeData *)sdata_1);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}